

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator<int,2ul>
          (iuValuesInParamsGenerator<int> *this,int (*values) [2])

{
  (this->super_iuIParamGenerator<int>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_0023ed38;
  (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_it)._M_current = (int *)0x0;
  std::vector<int,std::allocator<int>>::insert<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->m_values,(const_iterator)0x0,*values,
             values[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }